

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  char cVar1;
  uint32_t id;
  uint32_t uVar2;
  uint id_00;
  Dim DVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  SPIRType *pSVar8;
  char *pcVar9;
  long *plVar10;
  SPIRType *pSVar11;
  undefined8 *puVar12;
  runtime_error *this_00;
  size_type *psVar13;
  byte bVar14;
  CompilerGLSL *pCVar15;
  _Alloc_hider _Var16;
  string *in_R8;
  char (*in_R9) [2];
  char *pcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  SPIRType expected_type;
  char (*in_stack_fffffffffffffdd8) [4];
  string local_218;
  SPIRType *local_1f8;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [24];
  uint32_t uStack_198;
  undefined4 uStack_194;
  uint *local_190;
  size_t local_188;
  uint local_178 [8];
  bool *local_158;
  size_t local_150;
  bool local_140 [24];
  TypedID<(spirv_cross::Types)1> *local_128;
  size_t local_120;
  TypedID<(spirv_cross::Types)1> local_110 [8];
  uint *local_f0;
  size_t local_e8;
  uint local_d8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  bool *local_58;
  string local_50;
  
  id = (args->base).img.id;
  pSVar8 = (args->base).imgtype;
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = p_forward;
  if ((args->base).is_fetch == true) {
    convert_separate_image_to_expression_abi_cxx11_((string *)local_1b0,this,id);
  }
  else {
    to_non_uniform_aware_expression_abi_cxx11_((string *)local_1b0,this,id);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if ((args->nonuniform_expression == true) &&
     (lVar7 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b), lVar7 != -1)) {
    in_R8 = (string *)0x314a82;
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((string *)local_1b0,(spirv_cross *)&(this->backend).nonuniform_qualifier,
               (char **)0x309149,(char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x314a82,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  bVar6 = (this->backend).swizzle_is_function;
  local_1f8 = pSVar8;
  bVar5 = should_forward(this,args->coord);
  uVar2 = args->coord_components;
  pSVar8 = Compiler::expression_type(&this->super_Compiler,args->coord);
  pcVar17 = "";
  if (uVar2 != pSVar8->vecsize) {
    if (uVar2 == 1) {
      pcVar17 = ".x";
    }
    else {
      if (uVar2 == 3) {
        pcVar9 = ".xyz()";
        pcVar17 = ".xyz";
      }
      else {
        if (uVar2 != 2) goto LAB_00275755;
        pcVar9 = ".xy()";
        pcVar17 = ".xy";
      }
      if (bVar6 != false) {
        pcVar17 = pcVar9;
      }
    }
  }
LAB_00275755:
  cVar1 = *pcVar17;
  if (cVar1 == '\0') {
    to_expression_abi_cxx11_(&local_1f0,this,args->coord,true);
  }
  else {
    to_enclosed_expression_abi_cxx11_(&local_50,this,args->coord,true);
    plVar10 = (long *)::std::__cxx11::string::append((char *)&local_50);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1f0.field_2._M_allocated_capacity = *psVar13;
      local_1f0.field_2._8_8_ = plVar10[3];
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar13;
      local_1f0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1f0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
  }
  pSVar8 = local_1f8;
  if ((cVar1 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pSVar11 = Compiler::expression_type(&this->super_Compiler,args->coord);
  if (pSVar11->basetype == UInt) {
    SPIRType::SPIRType((SPIRType *)local_1b0,pSVar11);
    uStack_198 = args->coord_components;
    local_1b0._16_4_ = 7;
    in_R8 = &local_1f0;
    bitcast_expression(&local_218,this,(SPIRType *)local_1b0,pSVar11->basetype,in_R8);
    ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    local_1b0._0_8_ = &PTR__SPIRType_003a8f58;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_98);
    local_e8 = 0;
    if (local_f0 != local_d8) {
      free(local_f0);
    }
    pSVar8 = local_1f8;
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    local_150 = 0;
    if (local_158 != local_140) {
      free(local_158);
    }
    local_188 = 0;
    if (local_190 != local_178) {
      free(local_190);
    }
  }
  if (((((pSVar8->image).arrayed == true) && ((pSVar8->image).dim == Dim2D)) ||
      ((pSVar8->image).dim == DimCube)) &&
     (bVar6 = Compiler::is_depth_image(&this->super_Compiler,pSVar8,id), bVar6 && args->lod != 0)) {
    bVar14 = (args->base).is_fetch ^ 1;
  }
  else {
    bVar14 = 0;
  }
  id_00 = args->dref;
  pCVar15 = (CompilerGLSL *)(ulong)id_00;
  if (id_00 == 0) {
    if (((local_1f8->image).dim == Dim1D) && ((this->options).es == true)) {
      bVar6 = (local_1f8->image).arrayed;
      if (pSVar11->basetype - Half < 3) {
        if ((bVar6 != false) || ((args->base).is_proj == true)) {
          enclose_expression(&local_218,pCVar15,&local_1f0);
          enclose_expression(&local_1d0,pCVar15,&local_1f0);
          join<char_const(&)[6],std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[4]>
                    ((string *)local_1b0,(spirv_cross *)0x311649,(char (*) [6])&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ".x, 0.0, ",(char (*) [10])&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f5626,
                     in_stack_fffffffffffffdd8);
          goto LAB_00275e37;
        }
        join<char_const(&)[6],std::__cxx11::string&,char_const(&)[7]>
                  ((string *)local_1b0,(spirv_cross *)0x3133c4,(char (*) [6])&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", 0.0)",
                   (char (*) [7])in_R8);
LAB_00276192:
        ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b0);
        psVar4 = (string *)local_1b0;
        _Var16._M_p = (pointer)local_1b0._0_8_;
      }
      else {
        if (bVar6 == false) {
          join<char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                    ((string *)local_1b0,(spirv_cross *)"ivec2(",(char (*) [7])&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3137e4,
                     (char (*) [5])in_R8);
          goto LAB_00276192;
        }
        enclose_expression(&local_218,pCVar15,&local_1f0);
        enclose_expression(&local_1d0,pCVar15,&local_1f0);
        join<char_const(&)[7],std::__cxx11::string,char_const(&)[8],std::__cxx11::string,char_const(&)[4]>
                  ((string *)local_1b0,(spirv_cross *)"ivec3(",(char (*) [7])&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".x, 0, ",
                   (char (*) [8])&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f5626,
                   in_stack_fffffffffffffdd8);
LAB_00275e37:
        ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b0);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        psVar4 = &local_218;
        _Var16._M_p = local_218._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var16._M_p != &psVar4->field_2) {
        operator_delete(_Var16._M_p);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
  }
  else {
    if (bVar5) {
      bVar5 = should_forward(this,id_00);
    }
    else {
      bVar5 = false;
    }
    if (((args->base).is_gather == false) && (args->coord_components != 4)) {
      if ((args->base).is_proj != true) {
        pSVar8 = Compiler::expression_type(&this->super_Compiler,args->coord);
        SPIRType::SPIRType((SPIRType *)local_1b0,pSVar8);
        uStack_198 = args->coord_components + 1;
        if (((local_1f8->image).dim == Dim1D) && ((this->options).es == true)) {
          uStack_198 = args->coord_components + 2;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        type_to_glsl_constructor_abi_cxx11_(&local_218,this,(SPIRType *)local_1b0);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_218._M_dataplus._M_p);
        paVar18 = &local_218.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar18) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        pCVar15 = (CompilerGLSL *)0x309149;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (((local_1f8->image).dim == Dim1D) && ((this->options).es == true)) {
          if ((local_1f8->image).arrayed == true) {
            enclose_expression(&local_1d0,pCVar15,&local_1f0);
            plVar10 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_218.field_2._M_allocated_capacity = *psVar13;
              local_218.field_2._8_8_ = plVar10[3];
              local_218._M_dataplus._M_p = (pointer)paVar18;
            }
            else {
              local_218.field_2._M_allocated_capacity = *psVar13;
              local_218._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_218._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_218._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != paVar18) {
              operator_delete(local_218._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            pCVar15 = (CompilerGLSL *)0x311639;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            enclose_expression(&local_1d0,pCVar15,&local_1f0);
            puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1d0);
            psVar13 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_218.field_2._M_allocated_capacity = *psVar13;
              local_218.field_2._8_8_ = puVar12[3];
              local_218._M_dataplus._M_p = (pointer)paVar18;
            }
            else {
              local_218.field_2._M_allocated_capacity = *psVar13;
              local_218._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_218._M_string_length = puVar12[1];
            *puVar12 = psVar13;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_218._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != paVar18) {
              operator_delete(local_218._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
          }
          else {
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_(&local_218,this,args->dref,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_218._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar18) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_1b0._0_8_ = &PTR__SPIRType_003a8f58;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_98);
        local_e8 = 0;
        if (local_f0 != local_d8) {
          free(local_f0);
        }
        local_120 = 0;
        if (local_128 != local_110) {
          free(local_128);
        }
        local_150 = 0;
        if (local_158 != local_140) {
          free(local_158);
        }
        local_188 = 0;
        if (local_190 != local_178) {
          free(local_190);
        }
        goto LAB_002761da;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      DVar3 = (local_1f8->image).dim;
      if (DVar3 == Dim2D) {
        to_enclosed_expression_abi_cxx11_(&local_218,this,args->coord,true);
        plVar10 = (long *)::std::__cxx11::string::append((char *)&local_218);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1b0 + 0x10);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1b0._16_8_ = *psVar13;
          _uStack_198 = plVar10[3];
          local_1b0._0_8_ = paVar18;
        }
        else {
          local_1b0._16_8_ = *psVar13;
          local_1b0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_1b0._8_8_ = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != paVar18) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != paVar18) {
          operator_delete((void *)local_1b0._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_(&local_218,this,args->coord,true);
        plVar10 = (long *)::std::__cxx11::string::append((char *)&local_218);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1b0._16_8_ = *psVar13;
          _uStack_198 = plVar10[3];
          local_1b0._0_8_ = paVar18;
        }
        else {
          local_1b0._16_8_ = *psVar13;
          local_1b0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_1b0._8_8_ = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      }
      else {
        if (DVar3 != Dim1D) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(this_00,"Invalid type for textureProj with shadow.");
          *(undefined ***)this_00 = &PTR__runtime_error_003a8f30;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_(&local_218,this,args->coord,true);
        plVar10 = (long *)::std::__cxx11::string::append((char *)&local_218);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1b0 + 0x10);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1b0._16_8_ = *psVar13;
          _uStack_198 = plVar10[3];
          local_1b0._0_8_ = paVar18;
        }
        else {
          local_1b0._16_8_ = *psVar13;
          local_1b0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_1b0._8_8_ = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != paVar18) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != paVar18) {
          operator_delete((void *)local_1b0._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_(&local_218,this,args->coord,true);
        puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_218);
        psVar13 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1b0._16_8_ = *psVar13;
          _uStack_198 = puVar12[3];
          local_1b0._0_8_ = paVar18;
        }
        else {
          local_1b0._16_8_ = *psVar13;
          local_1b0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar12;
        }
        local_1b0._8_8_ = puVar12[1];
        *puVar12 = psVar13;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      }
      paVar18 = &local_218.field_2;
      _Var16._M_p = local_218._M_dataplus._M_p;
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_);
        _Var16._M_p = local_218._M_dataplus._M_p;
      }
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_1b0,this,args->coord,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1b0 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != paVar18) {
        operator_delete((void *)local_1b0._0_8_);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      _Var16._M_p = (pointer)local_1b0._0_8_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var16._M_p != paVar18) {
      operator_delete(_Var16._M_p);
    }
  }
LAB_002761da:
  if (args->grad_y != 0 || args->grad_x != 0) {
    if ((bVar5 == false) || (bVar6 = should_forward(this,args->grad_x), !bVar6)) {
      bVar5 = false;
    }
    else {
      bVar5 = should_forward(this,args->grad_y);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->grad_x,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->grad_y,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->lod == 0) {
    if ((((args->base).is_fetch != true) || ((local_1f8->image).dim == DimBuffer)) ||
       ((local_1f8->image).ms != false)) goto LAB_002763c5;
  }
  else {
    if (bVar14 == 0) {
      if (bVar5 == false) {
        bVar5 = false;
      }
      else {
        bVar5 = should_forward(this,args->lod);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((((args->base).is_fetch == true) && ((local_1f8->image).dim != DimBuffer)) &&
         ((local_1f8->image).ms == false)) {
        bitcast_expression_abi_cxx11_((string *)local_1b0,this,Int,args->lod);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      }
      else {
        to_expression_abi_cxx11_((string *)local_1b0,this,args->lod,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      }
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_);
      }
      goto LAB_002763c5;
    }
    DVar3 = (local_1f8->image).dim;
    if ((DVar3 != Dim2D) && (DVar3 != DimCube)) goto LAB_002763c5;
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002763c5:
  if (args->offset != 0) {
    if (bVar5 == false) {
      bVar5 = false;
    }
    else {
      bVar5 = should_forward(this,args->offset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)local_1b0,this,Int,args->offset);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->sample != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)local_1b0,this,Int,args->sample);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->min_lod != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->min_lod,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->sparse_texel != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->sparse_texel,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->bias != 0) {
    if (bVar5 == false) {
      bVar5 = false;
    }
    else {
      bVar5 = should_forward(this,args->bias);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->bias,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if ((args->component != 0) && (bVar6 = expression_is_constant_null(this,args->component), !bVar6))
  {
    if (bVar5 == false) {
      bVar5 = false;
    }
    else {
      bVar5 = should_forward(this,args->component);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)local_1b0,this,Int,args->component);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  *local_58 = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_non_uniform_aware_expression(img);

	if (args.nonuniform_expression && farg_str.find_first_of('[') != string::npos)
	{
		// Only emit nonuniformEXT() wrapper if the underlying expression is arrayed in some way.
		farg_str = join(backend.nonuniform_qualifier, "(", farg_str, ")");
	}

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, img) && args.lod != 0 && !args.base.is_fetch;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			if (imgtype.image.dim == Dim1D && options.es)
				type.vecsize++;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";

			if (imgtype.image.dim == Dim1D && options.es)
			{
				if (imgtype.image.arrayed)
				{
					farg_str += enclose_expression(coord_expr) + ".x";
					farg_str += ", 0.0, ";
					farg_str += enclose_expression(coord_expr) + ".y";
				}
				else
				{
					farg_str += coord_expr;
					farg_str += ", 0.0";
				}
			}
			else
				farg_str += coord_expr;

			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		if (imgtype.image.dim == Dim1D && options.es)
		{
			// Have to fake a second coordinate.
			if (type_is_floating_point(coord_type))
			{
				// Cannot mix proj and array.
				if (imgtype.image.arrayed || args.base.is_proj)
				{
					coord_expr = join("vec3(", enclose_expression(coord_expr), ".x, 0.0, ",
					                  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("vec2(", coord_expr, ", 0.0)");
			}
			else
			{
				if (imgtype.image.arrayed)
				{
					coord_expr = join("ivec3(", enclose_expression(coord_expr),
									  ".x, 0, ",
									  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("ivec2(", coord_expr, ", 0)");
			}
		}

		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			forward = forward && should_forward(args.lod);
			farg_str += ", ";

			// Lod expression for TexelFetch in GLSL must be int, and only int.
			if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
				farg_str += bitcast_expression(SPIRType::Int, args.lod);
			else
				farg_str += to_expression(args.lod);
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component && !expression_is_constant_null(args.component))
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.component);
	}

	*p_forward = forward;

	return farg_str;
}